

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O1

HighsSolution * __thiscall HEkk::getSolution(HighsSolution *__return_storage_ptr__,HEkk *this)

{
  int iVar1;
  ObjSense OVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer piVar5;
  pointer pdVar6;
  pointer pdVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  
  __return_storage_ptr__->value_valid = false;
  __return_storage_ptr__->dual_valid = false;
  (__return_storage_ptr__->col_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->col_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->col_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->col_dual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->col_dual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->col_dual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->row_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->row_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->row_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->row_dual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->row_dual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->row_dual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar1 = (this->lp_).num_row_;
  lVar8 = (long)iVar1;
  if (0 < lVar8) {
    pdVar3 = (this->info_).workValue_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (this->info_).baseValue_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar5 = (this->basis_).basicIndex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar10 = 0;
    do {
      pdVar3[piVar5[lVar10]] = pdVar4[lVar10];
      lVar10 = lVar10 + 1;
    } while (lVar8 != lVar10);
  }
  if (0 < iVar1) {
    piVar5 = (this->basis_).basicIndex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (this->info_).workDual_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar10 = 0;
    do {
      pdVar3[piVar5[lVar10]] = 0.0;
      lVar10 = lVar10 + 1;
    } while (lVar8 != lVar10);
  }
  std::vector<double,_std::allocator<double>_>::resize
            (&__return_storage_ptr__->col_value,(long)(this->lp_).num_col_);
  std::vector<double,_std::allocator<double>_>::resize
            (&__return_storage_ptr__->col_dual,(long)(this->lp_).num_col_);
  std::vector<double,_std::allocator<double>_>::resize
            (&__return_storage_ptr__->row_value,(long)(this->lp_).num_row_);
  std::vector<double,_std::allocator<double>_>::resize
            (&__return_storage_ptr__->row_dual,(long)(this->lp_).num_row_);
  lVar8 = (long)(this->lp_).num_col_;
  if (0 < lVar8) {
    pdVar3 = (this->info_).workDual_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (this->info_).workValue_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (__return_storage_ptr__->col_value).super__Vector_base<double,_std::allocator<double>_>
             ._M_impl.super__Vector_impl_data._M_start;
    OVar2 = (this->lp_).sense_;
    pdVar7 = (__return_storage_ptr__->col_dual).super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    lVar10 = 0;
    do {
      pdVar6[lVar10] = pdVar4[lVar10];
      pdVar7[lVar10] = pdVar3[lVar10] * (double)OVar2;
      lVar10 = lVar10 + 1;
    } while (lVar8 != lVar10);
  }
  lVar10 = (long)(this->lp_).num_row_;
  if (0 < lVar10) {
    pdVar3 = (__return_storage_ptr__->row_value).super__Vector_base<double,_std::allocator<double>_>
             ._M_impl.super__Vector_impl_data._M_start;
    OVar2 = (this->lp_).sense_;
    lVar9 = 0;
    pdVar4 = (__return_storage_ptr__->row_dual).super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pdVar6 = (this->info_).workValue_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar7 = (this->info_).workDual_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      pdVar3[lVar9] = -pdVar6[lVar8 + lVar9];
      pdVar4[lVar9] = pdVar7[lVar8 + lVar9] * (double)-OVar2;
      lVar9 = lVar9 + 1;
    } while (lVar10 != lVar9);
  }
  __return_storage_ptr__->value_valid = true;
  __return_storage_ptr__->dual_valid = true;
  return __return_storage_ptr__;
}

Assistant:

HighsSolution HEkk::getSolution() {
  HighsSolution solution;
  // Scatter the basic primal values
  for (HighsInt iRow = 0; iRow < lp_.num_row_; iRow++)
    info_.workValue_[basis_.basicIndex_[iRow]] = info_.baseValue_[iRow];
  // Zero the basic dual values
  for (HighsInt iRow = 0; iRow < lp_.num_row_; iRow++)
    info_.workDual_[basis_.basicIndex_[iRow]] = 0;

  // Now we can get the solution
  solution.col_value.resize(lp_.num_col_);
  solution.col_dual.resize(lp_.num_col_);
  solution.row_value.resize(lp_.num_row_);
  solution.row_dual.resize(lp_.num_row_);

  for (HighsInt iCol = 0; iCol < lp_.num_col_; iCol++) {
    solution.col_value[iCol] = info_.workValue_[iCol];
    solution.col_dual[iCol] = (HighsInt)lp_.sense_ * info_.workDual_[iCol];
  }
  for (HighsInt iRow = 0; iRow < lp_.num_row_; iRow++) {
    solution.row_value[iRow] = -info_.workValue_[lp_.num_col_ + iRow];
    // @FlipRowDual negate RHS
    solution.row_dual[iRow] =
        -(HighsInt)lp_.sense_ * info_.workDual_[lp_.num_col_ + iRow];
  }
  solution.value_valid = true;
  solution.dual_valid = true;
  return solution;
}